

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O1

_ElementType __thiscall
Lib::
CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>
::next(CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>
       *this)

{
  char cVar1;
  _ElementType _Var2;
  
  if (*this == (CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>
                )0x1) {
    cVar1 = (**(code **)(**(long **)(this + 8) + 0x10))();
    if (cVar1 != '\0') goto LAB_0034e3f0;
    *this = (CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>
             )0x0;
  }
  (**(code **)(**(long **)(this + 0x10) + 0x10))();
LAB_0034e3f0:
  _Var2 = (_ElementType)(**(code **)(**(long **)(this + (ulong)((byte)*this ^ 1) * 8 + 8) + 0x18))()
  ;
  return _Var2;
}

Assistant:

OWN_ELEMENT_TYPE next()
  {
    ALWAYS(hasNext())
    if(_first) {
      //_it1 contains the next value, as hasNext must have
      //been called before. (It would have updated the
      //_first value otherwise.)
      return _it1.next();
    }
    return  _it2.next();
  }